

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcEllipseProfileDef::~IfcEllipseProfileDef(IfcEllipseProfileDef *this)

{
  undefined1 *puVar1;
  
  this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr._M_string_length =
       0x966b20;
  *(undefined8 *)
   &(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20 = 0x966b48;
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68
  ;
  if (puVar1 != &this[-1].super_IfcParameterizedProfileDef.field_0x78) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)
            ((long)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.
                    field_2 + 8);
  if (puVar1 != &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.
                   _M_string_length);
  return;
}

Assistant:

IfcEllipseProfileDef() : Object("IfcEllipseProfileDef") {}